

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

void __thiscall iDynTree::KinDynComputations::resizeInternalDataStructures(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  SpatialVector<iDynTree::SpatialMotionVector> *pSVar2;
  long lVar3;
  LinkIndex lnkIdx;
  long lVar4;
  
  iDynTree::FreeFloatingPos::resize((Model *)&this->pimpl->m_pos);
  iDynTree::FreeFloatingVel::resize((Model *)&this->pimpl->m_vel);
  iDynTree::LinkPositions::resize((Model *)&this->pimpl->m_linkPos);
  iDynTree::LinkVelArray::resize((Model *)&this->pimpl->m_linkVel);
  iDynTree::LinkInertias::resize((Model *)&this->pimpl->m_linkCRBIs);
  iDynTree::FreeFloatingMassMatrix::resize((Model *)&this->pimpl->m_rawMassMatrix);
  iDynTree::MatrixDynSize::zero();
  pKVar1 = this->pimpl;
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)&pKVar1->m_jacBuffer,6);
  iDynTree::MatrixDynSize::zero();
  SpatialVector<iDynTree::SpatialMotionVector>::zero
            ((SpatialVector<iDynTree::SpatialMotionVector> *)&this->pimpl->m_baseBiasAcc);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_linkBiasAcc);
  SpatialVector<iDynTree::SpatialMotionVector>::zero
            ((SpatialVector<iDynTree::SpatialMotionVector> *)&this->pimpl->m_baseAcc);
  iDynTree::FreeFloatingAcc::resize((Model *)&this->pimpl->m_generalizedAccs);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_linkAccs);
  SpatialVector<iDynTree::SpatialMotionVector>::zero
            ((SpatialVector<iDynTree::SpatialMotionVector> *)&this->pimpl->m_invDynBaseAcc);
  iDynTree::FreeFloatingAcc::resize((Model *)&this->pimpl->m_invDynGeneralizedProperAccs);
  iDynTree::LinkWrenches::resize((Model *)&this->pimpl->m_invDynNetExtWrenches);
  iDynTree::LinkWrenches::resize((Model *)&this->pimpl->m_invDynInternalWrenches);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_invDynLinkProperAccs);
  iDynTree::FreeFloatingVel::resize((Model *)&this->pimpl->m_invDynZeroVel);
  pSVar2 = (SpatialVector<iDynTree::SpatialMotionVector> *)iDynTree::FreeFloatingVel::baseVel();
  SpatialVector<iDynTree::SpatialMotionVector>::zero(pSVar2);
  iDynTree::FreeFloatingVel::jointVel();
  iDynTree::VectorDynSize::zero();
  iDynTree::LinkVelArray::resize((Model *)&this->pimpl->m_invDynZeroLinkVel);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_invDynZeroLinkProperAcc);
  iDynTree::LinkTraversalsCache::resize((Model *)&this->pimpl->m_traversalCache);
  iDynTree::FreeFloatingGeneralizedTorques::resize
            ((Model *)&this->pimpl->m_generalizedForcesContainer);
  lVar4 = 0;
  while( true ) {
    lVar3 = iDynTree::Model::getNrOfLinks();
    if (lVar3 <= lVar4) break;
    pSVar2 = (SpatialVector<iDynTree::SpatialMotionVector> *)
             iDynTree::LinkVelArray::operator()(&this->pimpl->m_invDynZeroLinkVel,lVar4);
    SpatialVector<iDynTree::SpatialMotionVector>::zero(pSVar2);
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void KinDynComputations::resizeInternalDataStructures()
{
    assert(this->pimpl->m_isModelValid);

    this->pimpl->m_pos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_vel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkPos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkCRBIs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.zero();
    this->pimpl->m_jacBuffer.resize(6,6+this->pimpl->m_robot_model.getNrOfDOFs());
    this->pimpl->m_jacBuffer.zero();
    this->pimpl->m_baseBiasAcc.zero();
    this->pimpl->m_linkBiasAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_baseAcc.zero();
    this->pimpl->m_generalizedAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynBaseAcc.zero();
    this->pimpl->m_invDynGeneralizedProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynNetExtWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynInternalWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynLinkProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.baseVel().zero();
    this->pimpl->m_invDynZeroVel.jointVel().zero();
    this->pimpl->m_invDynZeroLinkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroLinkProperAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_traversalCache.resize(this->pimpl->m_robot_model);
    this->pimpl->m_generalizedForcesContainer.resize(this->pimpl->m_robot_model);

    for(LinkIndex lnkIdx = 0; lnkIdx < static_cast<LinkIndex>(pimpl->m_robot_model.getNrOfLinks()); lnkIdx++)
    {
        pimpl->m_invDynZeroLinkVel(lnkIdx).zero();
    }
}